

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O0

unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
duckdb::ReservoirSample::Deserialize(Deserializer *deserializer)

{
  unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true> *this;
  ReservoirSample *in_RSI;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> in_RDI;
  unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true> result;
  unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
  reservoir_chunk;
  unsigned_long sample_count;
  pointer in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  field_id_t in_stack_ffffffffffffffc6;
  Deserializer *in_stack_ffffffffffffffc8;
  unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
  *in_stack_ffffffffffffffe0;
  unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
  *sample_count_00;
  
  this = (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true> *)
         Deserializer::ReadPropertyWithDefault<unsigned_long>
                   ((Deserializer *)in_RDI._M_head_impl,
                    (field_id_t)((ulong)in_RDI._M_head_impl >> 0x30),in_stack_ffffffffffffff98);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ReservoirChunk,std::default_delete<duckdb::ReservoirChunk>,true>>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc6,
             (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  operator_new(0x58);
  sample_count_00 = this;
  unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::unique_ptr
            ((unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
              *)this,(unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                      *)in_stack_ffffffffffffff88);
  ReservoirSample(in_RSI,(idx_t)sample_count_00,in_stack_ffffffffffffffe0);
  unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>::
  unique_ptr<std::default_delete<duckdb::ReservoirSample>,void>
            ((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
              *)this,in_stack_ffffffffffffff88);
  unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::~unique_ptr
            ((unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
              *)0xad8a09);
  unique_ptr<duckdb::BlockingSample,std::default_delete<duckdb::BlockingSample>,true>::
  unique_ptr<duckdb::ReservoirSample,std::default_delete<std::unique_ptr<duckdb::BlockingSample,std::default_delete<duckdb::BlockingSample>>>,void>
            (this,(unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>
                   *)in_stack_ffffffffffffff88);
  unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
               *)0xad8a22);
  unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::~unique_ptr
            ((unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
              *)0xad8a2c);
  return (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>)
         (_Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>)
         in_RDI._M_head_impl;
}

Assistant:

unique_ptr<BlockingSample> ReservoirSample::Deserialize(Deserializer &deserializer) {
	auto sample_count = deserializer.ReadPropertyWithDefault<idx_t>(200, "sample_count");
	auto reservoir_chunk = deserializer.ReadPropertyWithDefault<unique_ptr<ReservoirChunk>>(201, "reservoir_chunk");
	auto result = duckdb::unique_ptr<ReservoirSample>(new ReservoirSample(sample_count, std::move(reservoir_chunk)));
	return std::move(result);
}